

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_helper.c
# Opt level: O0

void helper_crypto_sha1h_aarch64(void *vd,void *vm)

{
  uint32_t uVar1;
  undefined8 local_38;
  CRYPTO_STATE m;
  uint64_t *rm;
  uint64_t *rd;
  void *vm_local;
  void *vd_local;
  
  local_38._0_4_ = (uint32_t)*vm;
  uVar1 = ror32((uint32_t)local_38,2);
  local_38 = (ulong)uVar1;
  *(ulong *)vd = local_38;
  *(undefined8 *)((long)vd + 8) = 0;
  return;
}

Assistant:

void HELPER(crypto_sha1h)(void *vd, void *vm)
{
    uint64_t *rd = vd;
    uint64_t *rm = vm;
    union CRYPTO_STATE m = { .l = { rm[0], rm[1] } };

    CR_ST_WORD(m, 0) = ror32(CR_ST_WORD(m, 0), 2);
    CR_ST_WORD(m, 1) = CR_ST_WORD(m, 2) = CR_ST_WORD(m, 3) = 0;

    rd[0] = m.l[0];
    rd[1] = m.l[1];
}